

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O2

EStatusCode __thiscall PDFWriter::SetupState(PDFWriter *this,string *inStateFilePath)

{
  bool bVar1;
  EStatusCode EVar2;
  Trace *this_00;
  PDFParser *pPVar3;
  ObjectIDType inObjectId;
  PDFObject *pPVar4;
  PDFDictionary *pPVar5;
  longlong lVar6;
  PDFIndirectObjectReference *pPVar7;
  PDFObjectCastPtr<PDFIndirectObjectReference> objectsContextObject;
  PDFObjectCastPtr<PDFDictionary> pdfWriterDictionary;
  PDFObjectCastPtr<PDFIndirectObjectReference> documentContextObject;
  PDFObjectCastPtr<PDFBoolean> isModifiedObject;
  StateReader reader;
  allocator<char> local_769;
  RefCountPtr<PDFIndirectObjectReference> local_768;
  RefCountPtr<PDFDictionary> local_758;
  RefCountPtr<PDFIndirectObjectReference> local_748;
  RefCountPtr<PDFBoolean> local_738;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  StateReader local_6a8;
  
  StateReader::StateReader(&local_6a8);
  EVar2 = StateReader::Start(&local_6a8,inStateFilePath);
  if (EVar2 == eSuccess) {
    pPVar3 = StateReader::GetObjectsReader(&local_6a8);
    inObjectId = StateReader::GetRootObjectID(&local_6a8);
    pPVar4 = PDFParser::ParseNewObject(pPVar3,inObjectId);
    pPVar5 = PDFObjectCast<PDFDictionary>(pPVar4);
    local_758._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036d8c0;
    local_758.mValue = pPVar5;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c8,"mIsModified",(allocator<char> *)&local_768);
    pPVar4 = PDFDictionary::QueryDirectObject(pPVar5,&local_6c8);
    local_738.mValue = PDFObjectCast<PDFBoolean>(pPVar4);
    local_738._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036f128;
    std::__cxx11::string::~string((string *)&local_6c8);
    bVar1 = PDFBoolean::GetValue(local_738.mValue);
    pPVar5 = local_758.mValue;
    this->mIsModified = bVar1;
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6e8,"mModifiedFileVersion",(allocator<char> *)&local_748);
      pPVar4 = PDFDictionary::QueryDirectObject(pPVar5,&local_6e8);
      local_768.mValue = (PDFIndirectObjectReference *)PDFObjectCast<PDFInteger>(pPVar4);
      local_768._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036f160;
      std::__cxx11::string::~string((string *)&local_6e8);
      lVar6 = PDFInteger::GetValue((PDFInteger *)local_768.mValue);
      this->mModifiedFileVersion = (EPDFVersion)lVar6;
      RefCountPtr<PDFInteger>::~RefCountPtr((RefCountPtr<PDFInteger> *)&local_768);
    }
    pPVar5 = local_758.mValue;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_708,"mObjectsContext",(allocator<char> *)&local_748);
    pPVar4 = PDFDictionary::QueryDirectObject(pPVar5,&local_708);
    pPVar7 = PDFObjectCast<PDFIndirectObjectReference>(pPVar4);
    local_768._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036db20;
    local_768.mValue = pPVar7;
    std::__cxx11::string::~string((string *)&local_708);
    pPVar3 = StateReader::GetObjectsReader(&local_6a8);
    EVar2 = ObjectsContext::ReadState(&this->mObjectsContext,pPVar3,pPVar7->mObjectID);
    pPVar5 = local_758.mValue;
    if (EVar2 == eSuccess) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_728,"mDocumentContext",&local_769);
      pPVar4 = PDFDictionary::QueryDirectObject(pPVar5,&local_728);
      pPVar7 = PDFObjectCast<PDFIndirectObjectReference>(pPVar4);
      local_748._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_0036db20;
      local_748.mValue = pPVar7;
      std::__cxx11::string::~string((string *)&local_728);
      pPVar3 = StateReader::GetObjectsReader(&local_6a8);
      EVar2 = PDFHummus::DocumentContext::ReadState
                        (&this->mDocumentContext,pPVar3,pPVar7->mObjectID);
      if (EVar2 == eSuccess) {
        StateReader::Finish(&local_6a8);
      }
      RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr(&local_748);
    }
    RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr(&local_768);
    RefCountPtr<PDFBoolean>::~RefCountPtr(&local_738);
    RefCountPtr<PDFDictionary>::~RefCountPtr(&local_758);
  }
  else {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,"PDFWriter::SetupState, cant start state readering");
  }
  StateReader::~StateReader(&local_6a8);
  return EVar2;
}

Assistant:

EStatusCode PDFWriter::SetupState(const std::string& inStateFilePath)
{
	EStatusCode status;

	do
	{
		StateReader reader;

		status = reader.Start(inStateFilePath);
		if(status != eSuccess)
		{
			TRACE_LOG("PDFWriter::SetupState, cant start state readering");
			break;
		}

		PDFObjectCastPtr<PDFDictionary> pdfWriterDictionary(reader.GetObjectsReader()->ParseNewObject(reader.GetRootObjectID()));

        PDFObjectCastPtr<PDFBoolean> isModifiedObject(pdfWriterDictionary->QueryDirectObject("mIsModified"));
        mIsModified = isModifiedObject->GetValue();

        if(mIsModified)
        {
            PDFObjectCastPtr<PDFInteger> isModifiedFileVersionObject(pdfWriterDictionary->QueryDirectObject("mModifiedFileVersion"));
            mModifiedFileVersion = (EPDFVersion)(isModifiedFileVersionObject->GetValue());
        }

		PDFObjectCastPtr<PDFIndirectObjectReference> objectsContextObject(pdfWriterDictionary->QueryDirectObject("mObjectsContext"));
		status = mObjectsContext.ReadState(reader.GetObjectsReader(),objectsContextObject->mObjectID);
		if(status!= eSuccess)
			break;

		PDFObjectCastPtr<PDFIndirectObjectReference> documentContextObject(pdfWriterDictionary->QueryDirectObject("mDocumentContext"));
		status = mDocumentContext.ReadState(reader.GetObjectsReader(),documentContextObject->mObjectID);
		if(status!= eSuccess)
			break;

		reader.Finish();

	}while(false);

	return status;
}